

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O3

void __thiscall BamTools::ResolveTool::StatsFileWriter::WriteHeader(StatsFileWriter *this)

{
  ostream *poVar1;
  stringstream versionStream;
  char local_1b1;
  char local_1b0;
  undefined7 uStack_1af;
  long local_1a8;
  undefined1 local_1a0 [16];
  stringstream local_190 [16];
  ostream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::stringstream::stringstream(local_190);
  local_1b0 = 'v';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_180,&local_1b0,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,2);
  local_1b0 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b0,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,5);
  local_1b0 = '.';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b0,1);
  std::ostream::operator<<(poVar1,1);
  local_1b0 = '#';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,&local_1b0,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," bamtools resolve (",0x13);
  std::__cxx11::stringbuf::str();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)CONCAT71(uStack_1af,local_1b0),local_1a8);
  local_1b1 = ')';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b1,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  local_1b1 = '#';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b1,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,MODEL_DESCRIPTION_abi_cxx11_._M_dataplus._M_p,
                      MODEL_DESCRIPTION_abi_cxx11_._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((undefined1 *)CONCAT71(uStack_1af,local_1b0) != local_1a0) {
    operator_delete((undefined1 *)CONCAT71(uStack_1af,local_1b0));
  }
  std::__cxx11::stringstream::~stringstream(local_190);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void ResolveTool::StatsFileWriter::WriteHeader()
{

    // stringify current bamtools version
    std::stringstream versionStream;
    versionStream << 'v' << BAMTOOLS_VERSION_MAJOR << '.' << BAMTOOLS_VERSION_MINOR << '.'
                  << BAMTOOLS_VERSION_PATCH;

    // # bamtools resolve (vX.Y.Z)
    // #
    // # MODEL DESCRIPTION - see above for actual text
    // \n

    m_stream << COMMENT_CHAR << " bamtools resolve (" << versionStream.str() << ')' << std::endl
             << COMMENT_CHAR << std::endl
             << MODEL_DESCRIPTION << std::endl;
}